

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileGate.cpp
# Opt level: O2

State __thiscall
TileGate::_findNextStateAND
          (TileGate *this,State *adjacentStates,int numInputs,int numHigh,int numMiddle)

{
  if (1 < numInputs) {
    if (numHigh == numInputs) {
      return HIGH;
    }
    if (numMiddle + numHigh == numInputs) {
      return MIDDLE;
    }
  }
  return LOW;
}

Assistant:

State TileGate::_findNextStateAND(State adjacentStates[4], int numInputs, int numHigh, int numMiddle) const {
    if (numInputs >= 2) {
        if (numHigh == numInputs) {
            return HIGH;
        } else if (numHigh + numMiddle == numInputs) {
            return MIDDLE;
        }
    }
    return LOW;
}